

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::onConfigChanged(Miner *this,Config *config,Config *previousConfig)

{
  bool bVar1;
  size_t sVar2;
  reference ppIVar3;
  BaseConfig *in_RDX;
  BaseConfig *in_RSI;
  Job *in_RDI;
  IBackend *backend;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range1;
  Job job;
  Pools *in_stack_fffffffffffffe98;
  Pools *in_stack_fffffffffffffec0;
  Miner *in_stack_fffffffffffffec8;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_130;
  size_t *local_128;
  undefined1 local_120 [264];
  BaseConfig *local_18;
  BaseConfig *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  BaseConfig::pools(in_RSI);
  BaseConfig::pools(local_18);
  bVar1 = Pools::operator!=((Pools *)in_RDI,in_stack_fffffffffffffe98);
  if (bVar1) {
    BaseConfig::pools(local_10);
    sVar2 = Pools::active(in_stack_fffffffffffffec0);
    if (sVar2 != 0) {
      return;
    }
  }
  Miner::job(in_stack_fffffffffffffec8);
  local_128 = &((pointer)(in_RDI->m_clientId).m_data)[1].m_daemon.m_host.m_size;
  local_130._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
                  in_stack_fffffffffffffe98);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end
            ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
             in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    ppIVar3 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_130);
    (*(*ppIVar3)->_vptr_IBackend[9])(*ppIVar3,local_120);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_130);
  }
  Job::~Job(in_RDI);
  return;
}

Assistant:

void xmrig::Miner::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() != previousConfig->pools() && config->pools().active() > 0) {
        return;
    }

    const Job job = this->job();

    for (IBackend *backend : d_ptr->backends) {
        backend->setJob(job);
    }
}